

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O0

int rhash_get_hash_length(uint hash_id)

{
  rhash_info *prVar1;
  int local_28;
  int local_20;
  rhash_info *info;
  uint hash_id_local;
  
  prVar1 = rhash_info_by_id(hash_id);
  if (prVar1 == (rhash_info *)0x0) {
    local_28 = 0;
  }
  else {
    if ((prVar1->flags & 1) == 0) {
      local_20 = (int)(prVar1->digest_size << 1);
    }
    else {
      local_20 = (int)((prVar1->digest_size * 8 + 4) / 5);
    }
    local_28 = local_20;
  }
  return local_28;
}

Assistant:

RHASH_API int rhash_get_hash_length(unsigned hash_id)
{
	const rhash_info* info = rhash_info_by_id(hash_id);
	return (int)(info ? (info->flags & F_BS32 ?
		BASE32_LENGTH(info->digest_size) : info->digest_size * 2) : 0);
}